

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimAnim.cpp
# Opt level: O2

void simanim::createAnimation(path *path,uint64_t frameWidth,uint64_t frameHeight)

{
  bool bVar1;
  ostream *poVar2;
  path local_270;
  path local_248;
  ofstream file;
  
  bVar1 = std::filesystem::exists(path);
  if (!bVar1) {
    std::filesystem::create_directories(path);
  }
  std::filesystem::__cxx11::path::path<char[9],std::filesystem::__cxx11::path>
            (&local_248,(char (*) [9])"time.txt",auto_format);
  std::filesystem::__cxx11::operator/(&local_270,path,&local_248);
  std::ofstream::ofstream(&file,local_270._M_pathname._M_dataplus._M_p,_S_out);
  std::filesystem::__cxx11::path::~path(&local_270);
  std::filesystem::__cxx11::path::~path(&local_248);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&file);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void createAnimation(const fs::path& path, uint64_t frameWidth, uint64_t frameHeight)
	{
		if (!fs::exists(path))
			fs::create_directories(path);

		std::ofstream file(path / "time.txt");
		file << frameWidth << " " << frameHeight << std::endl;
		file.close();
	}